

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_ManPrepareCuts(Of_Cut_t *pCuts,Of_Man_t *p,int iObj,int fAddUnit)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  word wVar4;
  uint *puVar5;
  int iVar6;
  int *__dest;
  
  iVar2 = Of_ObjHasCuts(p,iObj);
  if (iVar2 == 0) {
    pCuts->Delay = 0;
    pCuts->Flow = 0;
    *(undefined4 *)&pCuts->field_0x10 = 0x8000002;
    pCuts->pLeaves[0] = iObj;
    pCuts->Sign = 1L << ((byte)iObj & 0x3f);
    iVar2 = 1;
  }
  else {
    piVar3 = Of_ObjCutSet(p,iObj);
    puVar5 = (uint *)(piVar3 + 1);
    __dest = pCuts->pLeaves;
    for (iVar6 = 0; iVar2 = *piVar3, iVar6 < iVar2; iVar6 = iVar6 + 1) {
      *(undefined8 *)(__dest + -3) = 0;
      uVar1 = *puVar5;
      __dest[-1] = __dest[-1] & 0xf8000000U | uVar1 >> 5;
      __dest[-1] = *puVar5 << 0x1b | uVar1 >> 5;
      uVar1 = *puVar5;
      wVar4 = Of_CutGetSign((int *)(puVar5 + 1),uVar1 & 0x1f);
      ((Of_Cut_t *)(__dest + -5))->Sign = wVar4;
      memcpy(__dest,puVar5 + 1,(ulong)((uVar1 & 0x1f) << 2));
      puVar5 = puVar5 + (ulong)(*puVar5 & 0x1f) + 4;
      __dest = __dest + 0xc;
    }
    if ((fAddUnit != 0) && (0xfffffff < *(uint *)&pCuts->field_0x10)) {
      *(undefined8 *)(__dest + -3) = 0;
      __dest[-1] = 0x8000002;
      *__dest = iObj;
      ((Of_Cut_t *)(__dest + -5))->Sign = 1L << ((byte)iObj & 0x3f);
      iVar2 = iVar2 + 1;
    }
  }
  return iVar2;
}

Assistant:

static inline int Of_ManPrepareCuts( Of_Cut_t * pCuts, Of_Man_t * p, int iObj, int fAddUnit )
{
    if ( Of_ObjHasCuts(p, iObj) )
    {
        Of_Cut_t * pMfCut = pCuts;
        int i, * pCut, * pList = Of_ObjCutSet(p, iObj);
        Of_SetForEachCut( pList, pCut, i )
        {
            pMfCut->Delay   = 0;
            pMfCut->Flow    = 0;
            pMfCut->iFunc   = Of_CutFunc( pCut );
            pMfCut->nLeaves = Of_CutSize( pCut );
            pMfCut->Sign    = Of_CutGetSign( pCut+1, Of_CutSize(pCut) );
            memcpy( pMfCut->pLeaves, pCut+1, sizeof(int) * Of_CutSize(pCut) );
            pMfCut++;
        }
        if ( fAddUnit && pCuts->nLeaves > 1 )
            return pList[0] + Of_CutCreateUnit( pMfCut, iObj );
        return pList[0];
    }
    return Of_CutCreateUnit( pCuts, iObj );
}